

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O0

int net_udp4_socket(sockaddr_in *saddr,unsigned_short port,uchar ttl)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  undefined1 local_25;
  undefined4 local_24;
  int iStack_20;
  uchar loop;
  int on;
  int fd;
  uchar ttl_local;
  unsigned_short port_local;
  sockaddr_in *saddr_local;
  
  on._1_1_ = ttl;
  on._2_2_ = port;
  _fd = saddr;
  if (saddr == (sockaddr_in *)0x0) {
    __assert_fail("saddr != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/network4.c",0x3b,
                  "int net_udp4_socket(struct sockaddr_in *, unsigned short, unsigned char)");
  }
  iStack_20 = socket(2,2,0);
  if (iStack_20 < 0) {
    perror("socket");
    return -1;
  }
  local_24 = 1;
  iVar2 = setsockopt(iStack_20,1,2,&local_24,4);
  if (iVar2 < 0) {
    perror("setsockopt");
  }
  else {
    iVar2 = setsockopt(iStack_20,1,6,&net_udp4_socket::allow,4);
    if (iVar2 != -1) {
      _fd->sin_family = 2;
      uVar1 = htons(on._2_2_);
      _fd->sin_port = uVar1;
      uVar3 = htonl((_fd->sin_addr).s_addr);
      if ((uVar3 & 0xf0000000) == 0xe0000000) {
        local_25 = 1;
        iVar2 = setsockopt(iStack_20,0,0x21,(void *)((long)&on + 1),1);
        if ((iVar2 < 0) || (iVar2 = setsockopt(iStack_20,0,0x22,&local_25,1), iVar2 < 0)) {
          perror("setsockopt");
          goto LAB_00101689;
        }
      }
      return iStack_20;
    }
    perror("setsockopt");
  }
LAB_00101689:
  iVar2 = close(iStack_20);
  if (iVar2 < 0) {
    perror("close");
  }
  return -1;
}

Assistant:

int net_udp4_socket(struct sockaddr_in *saddr,
		    unsigned short port,
		    unsigned char ttl) {
  assert(saddr != NULL);
  
  /*M
    Create UDP socket.
  **/
  int fd;
  if ((fd = socket(PF_INET, SOCK_DGRAM, 0)) < 0) {
    perror("socket");
    return -1;
  }

  /*M
    Set socket to reuse addresses.
  **/
  int on = 1;
  if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)) < 0) {
    perror("setsockopt");
    goto error;
  }

  {
    static int allow = 1;
    if (setsockopt(fd, SOL_SOCKET, SO_BROADCAST, (char*)&allow, sizeof(allow)) == -1) {
      perror("setsockopt");
      goto error;
    }
  }
    
  saddr->sin_family = AF_INET;
  saddr->sin_port   = htons(port);

  /*M
    If the address is a multicast address, set the TTL and turn on
    multicast loop so the local host can receive the UDP packets.
  **/
  if (IN_MULTICAST(htonl(saddr->sin_addr.s_addr))) {
    unsigned char loop = 1;
    if ((setsockopt(fd,
                    IPPROTO_IP,
                    IP_MULTICAST_TTL,
                    &ttl, sizeof(ttl)) < 0) ||
        (setsockopt(fd,
                    IPPROTO_IP,
                    IP_MULTICAST_LOOP,
                    &loop, sizeof(loop)) < 0)) {
      perror("setsockopt");
      goto error;
    }
  }

  return fd;

 error:
  if (close(fd) < 0)
    perror("close");
  return -1;
}